

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a40d0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a40d7 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001a40c0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001a40c8 = 0x2e2e2e2e2e2e2e;
    DAT_001a40cf = 0x2e;
    _DAT_001a40b0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001a40b8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001a40a0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001a40a8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001a4098 = 0x2e2e2e2e2e2e2e2e;
    DAT_001a40df = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}